

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertFunctionPointersEqual
          (UtestShell *this,_func_void *expected,_func_void *actual,char *text,char *fileName,
          size_t lineNumber,TestTerminator *testTerminator)

{
  TestResult *pTVar1;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  SimpleString *in_R8;
  undefined8 in_stack_00000008;
  UtestShell *in_stack_ffffffffffffff08;
  SimpleString *in_stack_ffffffffffffff38;
  SimpleString *in_stack_ffffffffffffff40;
  _func_void *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  UtestShell *in_stack_ffffffffffffff58;
  EqualsFailure *in_stack_ffffffffffffff60;
  undefined1 local_98 [8];
  SimpleString *in_stack_ffffffffffffff70;
  
  pTVar1 = getTestResult(in_stack_ffffffffffffff08);
  (*pTVar1->_vptr_TestResult[10])();
  if (in_RSI != in_RDX) {
    StringFrom(in_stack_ffffffffffffff48);
    StringFrom(in_stack_ffffffffffffff48);
    SimpleString::SimpleString(in_R8,(char *)in_stack_ffffffffffffff08);
    EqualsFailure::EqualsFailure
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               (size_t)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38
               ,in_stack_ffffffffffffff70);
    (**(code **)(*in_RDI + 0x138))(in_RDI,local_98,in_stack_00000008);
    EqualsFailure::~EqualsFailure((EqualsFailure *)0x12312e);
    SimpleString::~SimpleString((SimpleString *)0x123138);
    SimpleString::~SimpleString((SimpleString *)0x123142);
    SimpleString::~SimpleString((SimpleString *)0x12314c);
  }
  return;
}

Assistant:

void UtestShell::assertFunctionPointersEqual(void (*expected)(), void (*actual)(), const char* text, const char* fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (expected != actual)
        failWith(EqualsFailure(this, fileName, lineNumber, StringFrom(expected), StringFrom(actual), text), testTerminator);
}